

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

void printsub(Curl_easy *data,int direction,uchar *pointer,size_t length)

{
  byte bVar1;
  byte bVar2;
  uchar uVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  ulong uVar9;
  
  if ((data->set).verbose != true) {
    return;
  }
  pcVar7 = "SENT";
  if (direction == 0x3c) {
    pcVar7 = "RCVD";
  }
  uVar6 = 0;
  Curl_infof(data,"%s IAC SB ",pcVar7);
  if (length < 3) goto LAB_00122311;
  bVar1 = pointer[length - 2];
  bVar2 = pointer[length - 1];
  if (bVar2 != 0xf0 || bVar1 != 0xff) {
    Curl_infof(data,"(terminated by ");
    if (bVar1 < 0x28) {
      pcVar7 = telnetoptions[bVar1];
LAB_00122282:
      Curl_infof(data,"%s ",pcVar7);
    }
    else {
      if (0xeb < bVar1) {
        pcVar7 = telnetcmds[bVar1 - 0xec];
        goto LAB_00122282;
      }
      Curl_infof(data,"%u ",(ulong)bVar1);
    }
    if (bVar2 < 0x28) {
      pcVar7 = telnetoptions[bVar2];
LAB_001222d9:
      Curl_infof(data,"%s",pcVar7);
    }
    else {
      if (0xeb < bVar2) {
        pcVar7 = telnetcmds[bVar2 - 0xec];
        goto LAB_001222d9;
      }
      Curl_infof(data,"%d");
    }
    Curl_infof(data,", not IAC SE!) ");
  }
  uVar6 = (ulong)bVar1;
LAB_00122311:
  uVar9 = length - 2;
  if (uVar9 == 0) {
    pcVar7 = "(Empty suboption?)";
  }
  else {
    uVar5 = (ulong)*pointer;
    if (uVar5 < 0x28) {
      if ((*pointer < 0x28) && ((0x8881000000U >> (uVar5 & 0x3f) & 1) != 0)) {
        pcVar7 = telnetoptions[uVar5];
        pcVar8 = "%s";
      }
      else {
        pcVar7 = telnetoptions[uVar5];
        pcVar8 = "%s (unsupported)";
      }
      Curl_infof(data,pcVar8,pcVar7);
    }
    else {
      Curl_infof(data,"%d (unknown)",(ulong)pointer[uVar6]);
    }
    if (*pointer == '\x1f') {
      pcVar7 = "\n";
      if (4 < uVar9) {
        Curl_infof(data,"Width: %d ; Height: %d",
                   (ulong)(ushort)(*(ushort *)(pointer + 1) << 8 | *(ushort *)(pointer + 1) >> 8),
                   (ulong)(ushort)(*(ushort *)(pointer + 3) << 8 | *(ushort *)(pointer + 3) >> 8));
      }
    }
    else {
      if ((ulong)pointer[1] < 4) {
        Curl_infof(data,&DAT_00151d30 + *(int *)(&DAT_00151d30 + (ulong)pointer[1] * 4));
      }
      uVar3 = *pointer;
      if ((uVar3 == '\x18') || (uVar3 == '#')) {
        pointer[uVar9] = '\0';
        Curl_infof(data," \"%s\"",pointer + 2);
        pcVar7 = "\n";
      }
      else {
        pcVar7 = "\n";
        if (uVar3 == '\'') {
          if ((pointer[1] == '\0') && (Curl_infof(data," "), 3 < uVar9)) {
            uVar6 = 3;
            uVar5 = 4;
            do {
              if (pointer[uVar6] == '\x01') {
                pcVar8 = " = ";
LAB_0012245f:
                Curl_infof(data,pcVar8);
              }
              else {
                if (pointer[uVar6] == '\0') {
                  pcVar8 = ", ";
                  goto LAB_0012245f;
                }
                Curl_infof(data,"%c");
              }
              bVar4 = uVar5 < uVar9;
              uVar6 = uVar5;
              uVar5 = (ulong)((int)uVar5 + 1);
            } while (bVar4);
          }
        }
        else if (2 < uVar9) {
          uVar6 = 2;
          uVar5 = 3;
          do {
            Curl_infof(data," %.2x",(ulong)pointer[uVar6]);
            bVar4 = uVar5 < uVar9;
            uVar6 = uVar5;
            uVar5 = (ulong)((int)uVar5 + 1);
          } while (bVar4);
        }
      }
    }
  }
  Curl_infof(data,pcVar7);
  return;
}

Assistant:

static void printsub(struct Curl_easy *data,
                     int direction,             /* '<' or '>' */
                     unsigned char *pointer,    /* where suboption data is */
                     size_t length)             /* length of suboption data */
{
  if(data->set.verbose) {
    unsigned int i = 0;
    if(direction) {
      infof(data, "%s IAC SB ", (direction == '<')? "RCVD":"SENT");
      if(length >= 3) {
        int j;

        i = pointer[length-2];
        j = pointer[length-1];

        if(i != CURL_IAC || j != CURL_SE) {
          infof(data, "(terminated by ");
          if(CURL_TELOPT_OK(i))
            infof(data, "%s ", CURL_TELOPT(i));
          else if(CURL_TELCMD_OK(i))
            infof(data, "%s ", CURL_TELCMD(i));
          else
            infof(data, "%u ", i);
          if(CURL_TELOPT_OK(j))
            infof(data, "%s", CURL_TELOPT(j));
          else if(CURL_TELCMD_OK(j))
            infof(data, "%s", CURL_TELCMD(j));
          else
            infof(data, "%d", j);
          infof(data, ", not IAC SE!) ");
        }
      }
      length -= 2;
    }
    if(length < 1) {
      infof(data, "(Empty suboption?)");
      return;
    }

    if(CURL_TELOPT_OK(pointer[0])) {
      switch(pointer[0]) {
      case CURL_TELOPT_TTYPE:
      case CURL_TELOPT_XDISPLOC:
      case CURL_TELOPT_NEW_ENVIRON:
      case CURL_TELOPT_NAWS:
        infof(data, "%s", CURL_TELOPT(pointer[0]));
        break;
      default:
        infof(data, "%s (unsupported)", CURL_TELOPT(pointer[0]));
        break;
      }
    }
    else
      infof(data, "%d (unknown)", pointer[i]);

    switch(pointer[0]) {
    case CURL_TELOPT_NAWS:
      if(length > 4)
        infof(data, "Width: %d ; Height: %d", (pointer[1]<<8) | pointer[2],
              (pointer[3]<<8) | pointer[4]);
      break;
    default:
      switch(pointer[1]) {
      case CURL_TELQUAL_IS:
        infof(data, " IS");
        break;
      case CURL_TELQUAL_SEND:
        infof(data, " SEND");
        break;
      case CURL_TELQUAL_INFO:
        infof(data, " INFO/REPLY");
        break;
      case CURL_TELQUAL_NAME:
        infof(data, " NAME");
        break;
      }

      switch(pointer[0]) {
      case CURL_TELOPT_TTYPE:
      case CURL_TELOPT_XDISPLOC:
        pointer[length] = 0;
        infof(data, " \"%s\"", &pointer[2]);
        break;
      case CURL_TELOPT_NEW_ENVIRON:
        if(pointer[1] == CURL_TELQUAL_IS) {
          infof(data, " ");
          for(i = 3; i < length; i++) {
            switch(pointer[i]) {
            case CURL_NEW_ENV_VAR:
              infof(data, ", ");
              break;
            case CURL_NEW_ENV_VALUE:
              infof(data, " = ");
              break;
            default:
              infof(data, "%c", pointer[i]);
              break;
            }
          }
        }
        break;
      default:
        for(i = 2; i < length; i++)
          infof(data, " %.2x", pointer[i]);
        break;
      }
    }
    if(direction)
      infof(data, "\n");
  }
}